

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>::setCapacity
          (Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *this,
          size_t newSize)

{
  MemberInfo **ppMVar1;
  ArrayBuilder<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> newBuilder;
  ArrayBuilder<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> local_30;
  
  ppMVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)ppMVar1 >> 3)) {
    (this->builder).pos = ppMVar1 + newSize;
  }
  local_30.ptr = kj::_::HeapArrayDisposer::
                 allocateUninitialized<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>
                           (newSize);
  local_30.endPtr = local_30.ptr + newSize;
  local_30.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_30.pos = local_30.ptr;
  ArrayBuilder<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>::
  addAll<kj::ArrayBuilder<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>
            ((ArrayBuilder<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*> *)
             &local_30,&this->builder);
  ArrayBuilder<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>::operator=
            (&this->builder,&local_30);
  ArrayBuilder<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>::dispose(&local_30);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }